

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# svglayoutstate.cpp
# Opt level: O2

Paint * __thiscall
lunasvg::parsePaint(Paint *__return_storage_ptr__,lunasvg *this,string_view input,
                   SVGLayoutState *state,Color *defaultValue)

{
  string_view input_00;
  string_view input_01;
  bool bVar1;
  Color CVar2;
  string id;
  string_view local_50;
  string local_40;
  
  local_50._M_str = (char *)input._M_len;
  local_40._M_dataplus._M_p = (pointer)&local_40.field_2;
  local_40._M_string_length = 0;
  local_40.field_2._M_local_buf[0] = '\0';
  local_50._M_len = (size_t)this;
  bVar1 = parseUrlValue(&local_50,&local_40);
  if (bVar1) {
    bVar1 = skipOptionalSpaces(&local_50);
    if (!bVar1) {
      Paint::Paint(__return_storage_ptr__,&local_40,(Color *)&Color::Transparent);
      goto LAB_00114fe7;
    }
    input_00._M_str = local_50._M_str;
    input_00._M_len = local_50._M_len;
    CVar2 = parseColorOrNone(input_00,(SVGLayoutState *)input._M_str,(Color *)state);
    std::__cxx11::string::string((string *)__return_storage_ptr__,(string *)&local_40);
  }
  else {
    input_01._M_str = local_50._M_str;
    input_01._M_len = local_50._M_len;
    CVar2 = parseColorOrNone(input_01,(SVGLayoutState *)input._M_str,(Color *)state);
    (__return_storage_ptr__->m_id)._M_dataplus._M_p =
         (pointer)&(__return_storage_ptr__->m_id).field_2;
    (__return_storage_ptr__->m_id)._M_string_length = 0;
    (__return_storage_ptr__->m_id).field_2._M_local_buf[0] = '\0';
  }
  (__return_storage_ptr__->m_color).m_value = CVar2.m_value;
LAB_00114fe7:
  std::__cxx11::string::~string((string *)&local_40);
  return __return_storage_ptr__;
}

Assistant:

static Paint parsePaint(std::string_view input, const SVGLayoutState* state, const Color& defaultValue)
{
    std::string id;
    if(!parseUrlValue(input, id))
        return Paint(parseColorOrNone(input, state, defaultValue));
    if(skipOptionalSpaces(input))
        return Paint(id, parseColorOrNone(input, state, defaultValue));
    return Paint(id, Color::Transparent);
}